

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O2

bool __thiscall
SI_GenericNoCase<char>::operator()(SI_GenericNoCase<char> *this,char *pLeft,char *pRight)

{
  char cVar1;
  long lVar2;
  char cVar3;
  char cVar4;
  
  lVar2 = 0;
  while( true ) {
    cVar3 = pLeft[lVar2];
    cVar1 = pRight[lVar2];
    if ((cVar3 == '\0') || (cVar1 == '\0')) {
      return cVar1 != '\0';
    }
    cVar4 = cVar3 + ' ';
    if ((byte)(cVar3 + 0xa5U) < 0xe6) {
      cVar4 = cVar3;
    }
    cVar3 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar3 = cVar1;
    }
    if (cVar4 != cVar3) break;
    lVar2 = lVar2 + 1;
  }
  return cVar4 < cVar3;
}

Assistant:

bool operator()(const SI_CHAR * pLeft, const SI_CHAR * pRight) const {
        long cmp;
        for ( ;*pLeft && *pRight; ++pLeft, ++pRight) {
            cmp = (long) locase(*pLeft) - (long) locase(*pRight);
            if (cmp != 0) {
                return cmp < 0;
            }
        }
        return *pRight != 0;
    }